

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,ReservedRange *proto,Descriptor *parent,ReservedRange *result)

{
  int iVar1;
  
  iVar1 = proto->start_;
  result->start = iVar1;
  result->end = proto->end_;
  if (0 < iVar1) {
    return;
  }
  AddError(this,*(string **)(parent + 8),&proto->super_Message,NUMBER,
           "Reserved numbers must be positive integers.");
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const DescriptorProto::ReservedRange& proto,
    const Descriptor* parent,
    Descriptor::ReservedRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Reserved numbers must be positive integers.");
  }
}